

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_files.c
# Opt level: O3

ngx_int_t ngx_create_file_mapping(ngx_file_mapping_t *fm)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  char *fmt;
  ngx_uint_t level;
  u_char *puVar4;
  ngx_log_t *pnVar5;
  
  iVar1 = open64((char *)fm->name,0x242,0x1a4);
  fm->fd = iVar1;
  if (iVar1 == -1) {
    pnVar5 = fm->log;
    if (pnVar5->log_level < 3) {
      return -1;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    puVar4 = fm->name;
    fmt = "open() \"%s\" failed";
    level = 3;
  }
  else {
    iVar1 = ftruncate64(iVar1,fm->size);
    if (iVar1 == -1) {
      pnVar5 = fm->log;
      if (2 < pnVar5->log_level) {
        piVar3 = __errno_location();
        ngx_log_error_core(3,pnVar5,*piVar3,"ftruncate() \"%s\" failed",fm->name);
      }
    }
    else {
      pvVar2 = mmap64((void *)0x0,fm->size,3,1,fm->fd,0);
      fm->addr = pvVar2;
      if (pvVar2 != (void *)0xffffffffffffffff) {
        return 0;
      }
      pnVar5 = fm->log;
      if (2 < pnVar5->log_level) {
        piVar3 = __errno_location();
        ngx_log_error_core(3,pnVar5,*piVar3,"mmap(%uz) \"%s\" failed",fm->size,fm->name);
      }
    }
    iVar1 = close(fm->fd);
    if (iVar1 != -1) {
      return -1;
    }
    pnVar5 = fm->log;
    if (pnVar5->log_level < 2) {
      return -1;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    puVar4 = fm->name;
    fmt = "close() \"%s\" failed";
    level = 2;
  }
  ngx_log_error_core(level,pnVar5,iVar1,fmt,puVar4);
  return -1;
}

Assistant:

ngx_int_t
ngx_create_file_mapping(ngx_file_mapping_t *fm)
{
    fm->fd = ngx_open_file(fm->name, NGX_FILE_RDWR, NGX_FILE_TRUNCATE,
                           NGX_FILE_DEFAULT_ACCESS);
    if (fm->fd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, fm->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", fm->name);
        return NGX_ERROR;
    }

    if (ftruncate(fm->fd, fm->size) == -1) {
        ngx_log_error(NGX_LOG_CRIT, fm->log, ngx_errno,
                      "ftruncate() \"%s\" failed", fm->name);
        goto failed;
    }

    fm->addr = mmap(NULL, fm->size, PROT_READ|PROT_WRITE, MAP_SHARED,
                    fm->fd, 0);
    if (fm->addr != MAP_FAILED) {
        return NGX_OK;
    }

    ngx_log_error(NGX_LOG_CRIT, fm->log, ngx_errno,
                  "mmap(%uz) \"%s\" failed", fm->size, fm->name);

failed:

    if (ngx_close_file(fm->fd) == NGX_FILE_ERROR) {
        ngx_log_error(NGX_LOG_ALERT, fm->log, ngx_errno,
                      ngx_close_file_n " \"%s\" failed", fm->name);
    }

    return NGX_ERROR;
}